

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  BrokerApp *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  CoreType in_stack_ffffffffffffffec;
  
  std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  BrokerApp(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

BrokerApp::BrokerApp(std::vector<std::string>&& args):
    BrokerApp(CoreType::DEFAULT, std::string{}, std::move(args))
{
}